

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O0

bool xercesc_4_0::XMLUri::processPath
               (XMLCh *pathStr,XMLSize_t pathStrLen,bool isSchemePresent,bool bAllowSpaces)

{
  XMLCh theChar;
  bool bVar1;
  bool bVar2;
  XMLCh local_32;
  bool isQuery;
  bool isOpaque;
  ulong uStack_30;
  XMLCh testChar;
  XMLSize_t index;
  bool bAllowSpaces_local;
  bool isSchemePresent_local;
  XMLSize_t pathStrLen_local;
  XMLCh *pathStr_local;
  
  if (pathStrLen != 0) {
    uStack_30 = 0;
    local_32 = L'\0';
    bVar2 = true;
    if (isSchemePresent) {
      bVar2 = *pathStr == L'/';
    }
    for (; ((uStack_30 < pathStrLen && (local_32 = pathStr[uStack_30], local_32 != L'?')) &&
           (local_32 != L'#')); uStack_30 = uStack_30 + 1) {
      if (local_32 == L'%') {
        if (((pathStrLen <= uStack_30 + 2) ||
            (bVar1 = XMLString::isHex(pathStr[uStack_30 + 1]), !bVar1)) ||
           (bVar1 = XMLString::isHex(pathStr[uStack_30 + 2]), !bVar1)) {
          return false;
        }
      }
      else if (local_32 == L' ') {
        if (!bAllowSpaces) {
          return false;
        }
      }
      else {
        bVar1 = isUnreservedCharacter(local_32);
        if ((!bVar1) &&
           (((bVar2 && (bVar1 = isPathCharacter(local_32), !bVar1)) ||
            ((!bVar2 && (bVar1 = isReservedCharacter(local_32), !bVar1)))))) {
          return false;
        }
      }
    }
    bVar2 = local_32 == L'?';
    if ((bVar2) || (local_32 == L'#')) {
      uStack_30 = uStack_30 + 1;
      while (uStack_30 < pathStrLen) {
        theChar = pathStr[uStack_30];
        if ((theChar == L'#') && (bVar2)) {
          bVar2 = false;
          uStack_30 = uStack_30 + 1;
        }
        else {
          if (theChar == L'%') {
            if (((pathStrLen <= uStack_30 + 2) ||
                (bVar1 = XMLString::isHex(pathStr[uStack_30 + 1]), !bVar1)) ||
               (bVar1 = XMLString::isHex(pathStr[uStack_30 + 2]), !bVar1)) {
              return false;
            }
          }
          else if (theChar == L' ') {
            if (!bAllowSpaces) {
              return false;
            }
          }
          else {
            bVar1 = isReservedOrUnreservedCharacter(theChar);
            if (!bVar1) {
              return false;
            }
          }
          uStack_30 = uStack_30 + 1;
        }
      }
    }
  }
  return true;
}

Assistant:

bool XMLUri::processPath(const XMLCh* const pathStr,
                         const XMLSize_t pathStrLen,
                         const bool isSchemePresent,
                         const bool bAllowSpaces/*=false*/)
{
    if (pathStrLen != 0)
    {
        XMLSize_t index = 0;
        XMLCh testChar = chNull;
        bool isOpaque = (!isSchemePresent || *pathStr == chForwardSlash);

        // path - everything up to query string or fragment
        //
        // RFC 2732 only allows '[' and ']' to appear in the opaque part.
        while (index < pathStrLen)
        {
            testChar = pathStr[index];
            if (testChar == chQuestion || testChar == chPound)
                break;

            if (testChar == chPercent)
            {
                if (index+2 >= pathStrLen ||
                    !XMLString::isHex(pathStr[index+1]) ||
                    !XMLString::isHex(pathStr[index+2]))
                        return false;
            }
            else if (testChar==chSpace)
            {
                if(!bAllowSpaces)
                    return false;
            }
            else if (!isUnreservedCharacter(testChar) &&
                     ((isOpaque && !isPathCharacter(testChar)) ||
                      (!isOpaque && !isReservedCharacter(testChar))))
            {
                return false;
            }

            index++;
        }

        // query - starts with ? and up to fragment or end
        // fragment - starts with #
        bool isQuery = (testChar == chQuestion);
        if (isQuery || testChar == chPound)
        {
            index++;
            while (index < pathStrLen)
            {
                testChar = pathStr[index];
                if (testChar == chPound && isQuery) {
                    isQuery = false;
                    index++;
                    continue;
                }

                if (testChar == chPercent)
                {
                    if (index+2 >= pathStrLen ||
                        !XMLString::isHex(pathStr[index+1]) ||
                        !XMLString::isHex(pathStr[index+2]))
                        return false;
                }
                else if (testChar==chSpace)
                {
                    if(!bAllowSpaces)
                        return false;
                }
                else if (!isReservedOrUnreservedCharacter(testChar))
                {
                    return false;
                }
                index++;
            }
        }
    } //if (pathStrLen...)

    return true;
}